

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O1

void __thiscall ui::Led::Toggle(Led *this)

{
  pointer pcVar1;
  long lVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_248 [2];
  long local_238 [2];
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  this->brightness_ = (uint)(this->brightness_ == 0);
  pcVar1 = (this->file_path_)._M_dataplus._M_p;
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,pcVar1,pcVar1 + (this->file_path_)._M_string_length);
  std::__cxx11::string::append((char *)local_248);
  std::ofstream::ofstream(&local_228,(string *)local_248,_S_out);
  std::ostream::operator<<(&local_228,this->brightness_);
  uVar3 = _execvp;
  lVar2 = _VTT;
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _execvp;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  pcVar1 = (this->file_path_)._M_dataplus._M_p;
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,pcVar1,pcVar1 + (this->file_path_)._M_string_length);
  std::__cxx11::string::append((char *)local_248);
  std::ofstream::ofstream(&local_228,(string *)local_248,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"none",4);
  local_228 = lVar2;
  *(undefined8 *)(local_220 + *(long *)(lVar2 + -0x18) + -8) = uVar3;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  FetchState(this);
  return;
}

Assistant:

void Toggle() {
    brightness_ = !brightness_;
    std::ofstream(file_path_ + "/brightness") << brightness_;
    std::ofstream(file_path_ + "/trigger") << "none";
    FetchState();
  }